

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StopWatch.h
# Opt level: O0

unsigned_long_long StopWatch::current(Precision prec)

{
  undefined1 local_28 [8];
  timeval t;
  unsigned_long_long uStack_10;
  Precision prec_local;
  
  t.tv_usec._4_4_ = prec;
  Rct::gettime((timeval *)local_28);
  if (t.tv_usec._4_4_ == Millisecond) {
    uStack_10 = (long)local_28 * 1000 + t.tv_sec / 1000;
  }
  else {
    uStack_10 = (long)local_28 * 1000000 + t.tv_sec;
  }
  return uStack_10;
}

Assistant:

static unsigned long long current(Precision prec)
    {
        timeval t;
        Rct::gettime(&t); // monotonic
        if (prec == Millisecond) {
            return (t.tv_sec * 1000) + (t.tv_usec / 1000);
        } else {
            return (t.tv_sec * 1000000) + t.tv_usec;
        }
    }